

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.h
# Opt level: O2

void __thiscall
MutableS2ShapeIndex::Iterator::InitStale
          (Iterator *this,MutableS2ShapeIndex *index,InitialPosition pos)

{
  const_iterator cVar1;
  
  this->index_ = index;
  cVar1 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 *)&index->cell_map_);
  (this->end_).node = cVar1.node;
  (this->end_).position = cVar1.position;
  if (pos == BEGIN) {
    cVar1 = gtl::internal_btree::
            btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
            ::begin((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                     *)&this->index_->cell_map_);
    (this->iter_).node = cVar1.node;
    (this->iter_).position = cVar1.position;
  }
  else {
    (this->iter_).position = (this->end_).position;
    (this->iter_).node = (this->end_).node;
  }
  Refresh(this);
  return;
}

Assistant:

inline void MutableS2ShapeIndex::Iterator::InitStale(
    const MutableS2ShapeIndex* index, InitialPosition pos) {
  index_ = index;
  end_ = index_->cell_map_.end();
  if (pos == BEGIN) {
    iter_ = index_->cell_map_.begin();
  } else {
    iter_ = end_;
  }
  Refresh();
}